

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O1

void msd_CE4(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t i;
  void *__ptr;
  size_t sVar4;
  long *__ptr_00;
  void *__src;
  undefined2 uVar5;
  size_t i_1;
  long lVar6;
  size_t i_2;
  long lVar7;
  
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
    return;
  }
  __ptr = malloc(n * 2);
  sVar4 = 0;
  do {
    puVar2 = strings[sVar4];
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                    ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
    }
    if (puVar2[depth] == '\0') {
      uVar5 = 0;
    }
    else {
      uVar5 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
    }
    *(undefined2 *)((long)__ptr + sVar4 * 2) = uVar5;
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  __ptr_00 = (long *)calloc(0x10000,8);
  sVar4 = 0;
  do {
    __ptr_00[*(ushort *)((long)__ptr + sVar4 * 2)] =
         __ptr_00[*(ushort *)((long)__ptr + sVar4 * 2)] + 1;
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  __src = malloc(n * 8);
  msd_CE4::bucketindex[0] = 0;
  lVar6 = 0;
  sVar4 = 0;
  do {
    sVar4 = sVar4 + __ptr_00[lVar6];
    msd_CE4::bucketindex[lVar6 + 1] = sVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xffff);
  sVar4 = 0;
  do {
    puVar2 = strings[sVar4];
    uVar1 = *(ushort *)((long)__ptr + sVar4 * 2);
    sVar3 = msd_CE4::bucketindex[uVar1];
    msd_CE4::bucketindex[uVar1] = sVar3 + 1;
    *(uchar **)((long)__src + sVar3 * 8) = puVar2;
    sVar4 = sVar4 + 1;
  } while (n != sVar4);
  memcpy(strings,__src,n * 8);
  free(__src);
  free(__ptr);
  lVar6 = *__ptr_00;
  lVar7 = 1;
  do {
    sVar4 = __ptr_00[lVar7];
    if (sVar4 != 0) {
      if ((char)lVar7 != '\0') {
        msd_CE4(strings + lVar6,sVar4,depth + 2);
      }
      lVar6 = lVar6 + sVar4;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10000);
  free(__ptr_00);
  return;
}

Assistant:

static void
msd_CE4(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	uint16_t* restrict oracle =
		(uint16_t*) malloc(n*sizeof(uint16_t));
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE4(strings+bsum,
				bucketsize[i], depth+2);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}